

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::destroy
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  domain_type *pdVar1;
  
  pdVar1 = this->m_current;
  while (pdVar1 != this->m_start) {
    this->m_current = pdVar1 + -1;
    domain_type::~domain_type(pdVar1 + -1);
    pdVar1 = this->m_current;
  }
  operator_delete(this->m_data,this->m_size * 0x60);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}